

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O0

uint quarticSolver(double *ce,double *roots)

{
  uint uVar1;
  ostream *poVar2;
  void *pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint local_11c;
  double dStack_118;
  uint i_3;
  double ce2_1 [2];
  double sqrtz0_1;
  double dStack_f8;
  uint i_2;
  double ce2 [2];
  double sqrtz0;
  double dStack_d8;
  uint i_1;
  double croots [3];
  double local_b8;
  double cubic [3];
  double dStack_98;
  uint i;
  double cubic_1 [3];
  double t2 [2];
  double discriminant;
  double r;
  double q;
  double p;
  double a2;
  double shift2;
  double shift;
  uint ret;
  double *roots_local;
  double *ce_local;
  
  dVar4 = *ce * 0.25;
  dVar5 = *ce * *ce * -0.375 + ce[1];
  dVar6 = *ce * (*ce * *ce * 0.125 + -(ce[1] * 0.5)) + ce[2];
  dVar7 = (dVar4 * dVar4 * -3.0 + ce[1]) * dVar4 * dVar4 + -dVar4 * ce[2] + ce[3];
  poVar2 = std::operator<<((ostream *)&std::cout,"quarticSolver:: p=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar5);
  poVar2 = std::operator<<(poVar2,"\tq=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
  poVar2 = std::operator<<(poVar2,"\tr=");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,dVar7);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  if (1e-75 < ABS(dVar6)) {
    if (1e-75 <= ABS(dVar7)) {
      local_b8 = dVar5 * 2.0;
      cubic[0] = dVar5 * dVar5 + -(dVar7 * 4.0);
      cubic[1] = -dVar6 * dVar6;
      uVar1 = cubicSolver(&local_b8,&stack0xffffffffffffff28);
      poVar2 = std::operator<<((ostream *)&std::cout,"quarticSolver:: real roots from cubic: ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,uVar1);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      for (sqrtz0._4_4_ = 0; sqrtz0._4_4_ < uVar1; sqrtz0._4_4_ = sqrtz0._4_4_ + 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"cubic[");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sqrtz0._4_4_);
        poVar2 = std::operator<<(poVar2,"]=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,cubic[(ulong)sqrtz0._4_4_ - 1]);
        poVar2 = std::operator<<(poVar2," x= ");
        pvVar3 = (void *)std::ostream::operator<<
                                   (poVar2,*(double *)
                                            ((long)&stack0xffffffffffffff28 +
                                            (ulong)sqrtz0._4_4_ * 8));
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      }
      if (uVar1 == 1) {
        if (0.0 <= dStack_d8) {
          ce2[1] = sqrt(dStack_d8);
          dStack_f8 = -ce2[1];
          ce2[0] = (dVar5 + dStack_d8) * 0.5 + (dVar6 * 0.5) / ce2[1];
          uVar1 = quadraticSolver(&stack0xffffffffffffff08,roots);
          if (uVar1 == 0) {
            dStack_f8 = ce2[1];
            ce2[0] = (dVar5 + dStack_d8) * 0.5 + -((dVar6 * 0.5) / ce2[1]);
            quadraticSolver(&stack0xffffffffffffff08,roots);
          }
          for (sqrtz0_1._4_4_ = 0; sqrtz0_1._4_4_ < 2; sqrtz0_1._4_4_ = sqrtz0_1._4_4_ + 1) {
            roots[sqrtz0_1._4_4_] = roots[sqrtz0_1._4_4_] - dVar4;
          }
          ce_local._4_4_ = 2;
        }
        else {
          std::operator<<((ostream *)&std::cerr,
                          "Quartic Error:: Found one real root for cubic, but negative\n");
          ce_local._4_4_ = 0;
        }
      }
      else if ((dStack_d8 <= 0.0) || (croots[0] <= 0.0)) {
        ce_local._4_4_ = 0;
      }
      else {
        ce2_1[1] = sqrt(dStack_d8);
        dStack_118 = -ce2_1[1];
        ce2_1[0] = (dVar5 + dStack_d8) * 0.5 + (dVar6 * 0.5) / ce2_1[1];
        quadraticSolver(&stack0xfffffffffffffee8,roots);
        dStack_118 = ce2_1[1];
        ce2_1[0] = (dVar5 + dStack_d8) * 0.5 + -((dVar6 * 0.5) / ce2_1[1]);
        quadraticSolver(&stack0xfffffffffffffee8,roots + 2);
        for (local_11c = 0; local_11c < 4; local_11c = local_11c + 1) {
          roots[local_11c] = roots[local_11c] - dVar4;
        }
        ce_local._4_4_ = 4;
      }
    }
    else {
      dStack_98 = 0.0;
      *roots = 0.0;
      cubic_1[0] = dVar5;
      cubic_1[1] = dVar6;
      uVar1 = cubicSolver(&stack0xffffffffffffff68,roots + 1);
      ce_local._4_4_ = uVar1 + 1;
      for (cubic[2]._4_4_ = 0; cubic[2]._4_4_ < ce_local._4_4_; cubic[2]._4_4_ = cubic[2]._4_4_ + 1)
      {
        roots[cubic[2]._4_4_] = roots[cubic[2]._4_4_] - dVar4;
      }
    }
  }
  else {
    dVar6 = dVar5 * 0.25 * dVar5 + -dVar7;
    if (0.0 <= dVar6) {
      dVar6 = sqrt(dVar6);
      dVar6 = dVar5 * -0.5 + -dVar6;
      dVar5 = -dVar5 - dVar6;
      if (dVar6 < 0.0) {
        if (dVar5 < 0.0) {
          ce_local._4_4_ = 0;
        }
        else {
          dVar5 = sqrt(dVar5);
          *roots = dVar5 - dVar4;
          roots[1] = -*roots - dVar4;
          ce_local._4_4_ = 2;
        }
      }
      else {
        dVar7 = sqrt(dVar6);
        *roots = dVar7 - dVar4;
        dVar6 = sqrt(dVar6);
        roots[1] = -dVar6 - dVar4;
        dVar6 = sqrt(dVar5);
        roots[2] = dVar6 - dVar4;
        dVar5 = sqrt(dVar5);
        roots[3] = -dVar5 - dVar4;
        ce_local._4_4_ = 4;
      }
    }
    else {
      ce_local._4_4_ = 0;
    }
  }
  return ce_local._4_4_;
}

Assistant:

unsigned int quarticSolver(double * ce, double *roots)
//quartic solver
// x^4 + ce[0] x^3 + ce[1] x^2 + ce[2] x + ce[3] = 0
{
    // x^4 + a x^3 + b x^2 +c x + d = 0
    // depressed quartic, x= t - a/4
    // t^4 + ( b - 3/8 a^2 ) t^2 + (c - a b/2 + a^3/8) t + d - a c /4 + a^2 b/16 - 3 a^4/256 =0
    // t^4 + p t^2 + q t + r =0
    // p= b - (3./8)*a*a;
    // q= c - 0.5*a*b+(1./8)*a*a*a;
    // r= d - 0.25*a*c+(1./16)*a*a*b-(3./256)*a^4
    unsigned int ret=0;
    double shift=0.25*ce[0];
    double shift2=shift*shift;
    double a2=ce[0]*ce[0];
    double p= ce[1] - (3./8)*a2;
    double q= ce[2] + ce[0]*((1./8)*a2 - 0.5*ce[1]);
    double r= ce[3] - shift*ce[2] + (ce[1] - 3.*shift2)*shift2;
    std::cout<<"quarticSolver:: p="<<p<<"\tq="<<q<<"\tr="<<r<<std::endl;
    if (fabs(q) <= 1.0e-75) {// Biquadratic equations
        double discriminant= 0.25*p*p -r;
        if (discriminant < 0.) {
            return 0;
        }
        double t2[2];
        t2[0]=-0.5*p-sqrt(discriminant);
        t2[1]= -p - t2[0];
        if ( t2[0] >= 0. ) {// four real roots
            roots[0]=sqrt(t2[0])-shift;
            roots[1]= -sqrt(t2[0])-shift;
            roots[2]=sqrt(t2[1])-shift;
            roots[3]= -sqrt(t2[1])-shift;
            return 4;
        }
        if ( t2[1] >= 0.) { // two real roots
            roots[0]=sqrt(t2[1])-shift;
            roots[1]= -roots[0]-shift;
            return 2;
        }
        return 0;
    }
    if ( fabs(r)< 1.0e-75 ) {
        double cubic[3]= {0.,p,q};
        roots[0]=0.;
        ret=1+cubicSolver(cubic,roots+1);
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    // depressed quartic to two quadratic equations
    // t^4 + p t^2 + q t + r = ( t^2 + u t + v) ( t^2 - u t + w)
    // so,
    // 	p + u^2= w+v
    // 	q/u= w-v
    // 	r= wv
    // so,
    //  (p+u^2)^2 - (q/u)^2 = 4 r
    //  y=u^2,
    //  y^3 + 2 p y^2 + ( p^2 - 4 r) y - q^2 =0
    //
    double cubic[3]= {2.*p,p*p-4.*r,-q*q},croots[3];
    ret = cubicSolver(cubic,croots);
    std::cout<<"quarticSolver:: real roots from cubic: "<<ret<<std::endl;
    for(unsigned int i=0; i<ret; i++)
        std::cout<<"cubic["<<i<<"]="<<cubic[i]<<" x= "<<croots[i]<<std::endl;
    if (ret==1) { //one real root from cubic
        if (croots[0]< 0.) {//this should not happen
            std::cerr<<"Quartic Error:: Found one real root for cubic, but negative\n";
            return 0;
        }
        double sqrtz0=sqrt(croots[0]);
        double ce2[2];
        ce2[0]=	-sqrtz0;
        ce2[1]=0.5*(p+croots[0])+0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots);
        if (! ret ) {
            ce2[0]=	sqrtz0;
            ce2[1]=0.5*(p+croots[0])-0.5*q/sqrtz0;
            ret=quadraticSolver(ce2,roots);
        }
        ret=2;
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    if ( croots[0]> 0. && croots[1] > 0. ) {
        double sqrtz0=sqrt(croots[0]);
        double ce2[2];
        ce2[0]=	-sqrtz0;
        ce2[1]=0.5*(p+croots[0])+0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots);
        ce2[0]=	sqrtz0;
        ce2[1]=0.5*(p+croots[0])-0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots+2);
        ret=4;
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    return 0;



}